

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::EventModuleField::~EventModuleField(EventModuleField *this)

{
  EventModuleField *this_local;
  
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__EventModuleField_00309028;
  Event::~Event(&this->event);
  ModuleFieldMixin<(wabt::ModuleFieldType)10>::~ModuleFieldMixin
            (&this->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>);
  return;
}

Assistant:

explicit EventModuleField(const Location& loc = Location(),
                            string_view name = string_view())
      : ModuleFieldMixin<ModuleFieldType::Event>(loc), event(name) {}